

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

void __thiscall czh::lexer::NumberMatch::next(NumberMatch *this,Token *token)

{
  Token TVar1;
  State SVar2;
  undefined *puVar3;
  State SVar4;
  ulong uVar5;
  
  SVar2 = UNEXPECTED;
  switch(this->state) {
  case INIT:
    uVar5 = (ulong)*token;
    SVar2 = UNEXPECTED;
    if (uVar5 < 3) {
      puVar3 = &DAT_00172168;
LAB_0011ceef:
      SVar2 = *(State *)(puVar3 + uVar5 * 4);
    }
    break;
  case INT:
    switch(*token) {
    case INT:
      goto switchD_0011cf58_caseD_0;
    case DOT:
      SVar2 = DOT;
      break;
    default:
      goto switchD_0011cf58_caseD_2;
    case EXP:
switchD_0011cf58_caseD_3:
      SVar2 = EXP;
      break;
    case END:
switchD_0011cf58_caseD_5:
      SVar2 = END;
    }
    break;
  case INT_DOT:
    TVar1 = *token;
    if (TVar1 == INT) {
      return;
    }
    if (TVar1 == EXP) goto switchD_0011cf58_caseD_3;
    if (TVar1 == END) goto switchD_0011cf58_caseD_5;
switchD_0011cf58_caseD_2:
    SVar2 = UNEXPECTED;
    break;
  case SIGN:
    TVar1 = *token;
    SVar4 = (uint)(TVar1 != DOT) * 5 + DOT_NO_INT;
    SVar2 = INT;
    goto LAB_0011cf89;
  case DOT:
    uVar5 = (ulong)*token;
    SVar2 = UNEXPECTED;
    if (uVar5 < 6) {
      puVar3 = &DAT_00172174;
      goto LAB_0011ceef;
    }
    break;
  case DOT_NO_INT:
    SVar2 = (uint)(*token != INT) * 8 + INT_DOT;
    break;
  case EXP:
    TVar1 = *token;
    SVar4 = (uint)(TVar1 != SIGN) * 3 + EXP_SIGN;
    SVar2 = EXP_INT;
LAB_0011cf89:
    if (TVar1 != INT) {
      SVar2 = SVar4;
    }
    break;
  case EXP_SIGN:
    SVar2 = (uint)(*token != INT) * 2 + EXP_INT;
    break;
  case EXP_INT:
    if (*token == INT) {
      return;
    }
    SVar2 = END;
    if (*token != END) goto switchD_0011cf58_caseD_2;
  }
  this->state = SVar2;
switchD_0011cf58_caseD_0:
  return;
}

Assistant:

void next(const Token &token)
    {
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            case Token::SIGN:
              state = State::SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::INT;
              break;
            case Token::DOT:
              state = State::DOT_NO_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::DOT:
              state = State::DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::INT_DOT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT_NO_INT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::DOT:
          switch (token)
          {
            case Token::INT:
              state = State::INT_DOT;
              break;
            case Token::EXP:
              state = State::EXP;
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            case Token::SIGN:
              state = State::EXP_SIGN;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_SIGN:
          switch (token)
          {
            case Token::INT:
              state = State::EXP_INT;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EXP_INT:
          switch (token)
          {
            case Token::INT:
              break;
            case Token::END:
              state = State::END;
              break;
            default:
              state = State::UNEXPECTED;
              break;
          }
          break;
        default:
          state = State::UNEXPECTED;
          break;
      }
    }